

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_subbytes_op(sexp ctx,sexp self,sexp_sint_t n,sexp vec,sexp start,sexp end)

{
  sexp psVar1;
  sexp_sint_t n_00;
  sexp_uint_t sStack_50;
  sexp str;
  sexp_gc_var_t local_40;
  
  local_40.var = &str;
  str = (sexp)&DAT_0000043e;
  if ((((ulong)vec & 3) == 0) && (vec->tag == 8)) {
    if (((ulong)start & 1) == 0) {
      sStack_50 = 2;
      end = start;
    }
    else {
      if (end == (sexp)&DAT_0000003e) {
        end = (sexp)((vec->value).stack.length * 2 + 1);
      }
      if (((ulong)end & 1) != 0) {
        local_40.next = (ctx->value).context.saves;
        (ctx->value).context.saves = &local_40;
        str = sexp_alloc_tagged_aux(ctx,0x20,9);
        (str->value).type.name = vec;
        (str->value).type.cpl = (sexp)0x0;
        (str->value).type.slots = (sexp)(vec->value).flonum;
        psVar1 = sexp_substring_op(ctx,self,n_00,str,
                                   (sexp)(((ulong)start & 0xfffffffffffffffe) * 4 + 2),
                                   (sexp)(((ulong)end & 0xfffffffffffffffe) * 4 + 2));
        if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
          psVar1 = (sexp)(psVar1->value).flonum;
        }
        (ctx->value).context.saves = local_40.next;
        return psVar1;
      }
      sStack_50 = 2;
    }
  }
  else {
    sStack_50 = 8;
    end = vec;
  }
  psVar1 = sexp_type_exception(ctx,self,sStack_50,end);
  return psVar1;
}

Assistant:

sexp sexp_subbytes_op (sexp ctx, sexp self, sexp_sint_t n, sexp vec, sexp start, sexp end) {
  sexp res;
  sexp_gc_var1(str);
  sexp_assert_type(ctx, sexp_bytesp, SEXP_BYTES, vec);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, start);
  if (sexp_not(end))
    end = sexp_make_fixnum(sexp_bytes_length(vec));
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, end);
  sexp_gc_preserve1(ctx, str);
#if SEXP_USE_PACKED_STRINGS
  str = sexp_c_string(ctx, sexp_bytes_data(vec), sexp_bytes_length(vec));
#else
  str = sexp_alloc_type(ctx, string, SEXP_STRING);
  sexp_string_bytes(str) = vec;
  sexp_string_offset(str) = 0;
  sexp_string_size(str) = sexp_bytes_length(vec);
#endif
  res = sexp_substring_op(ctx, self, n, str, sexp_fixnum_to_string_cursor(start), sexp_fixnum_to_string_cursor(end));
  if (!sexp_exceptionp(res))
    res = sexp_string_to_bytes(ctx, res);
  sexp_gc_release1(ctx);
  return res;
}